

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O2

void __thiscall
haVoc::Movehistory::update
          (Movehistory *this,position *p,Move *m,Move *previous,int16 *depth,Score *eval,
          vector<Move,_std::allocator<Move>_> *quiets,Move *killers)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  Color CVar6;
  pointer pMVar7;
  U8 UVar8;
  bool bVar9;
  Score SVar10;
  Move *q;
  pointer pMVar11;
  int iVar12;
  vector<Move,_std::allocator<Move>_> *__range2;
  
  SVar10 = *eval;
  if (m->type == '\n') {
    iVar12 = (int)*depth * (int)*depth;
    CVar6 = (p->ifo).stm;
    bVar2 = m->f;
    bVar3 = m->t;
    piVar1 = (this->history)._M_elems[CVar6]._M_elems[bVar2]._M_elems + bVar3;
    *piVar1 = *piVar1 + iVar12;
    bVar4 = previous->f;
    bVar5 = previous->t;
    (this->counters)._M_elems[bVar4]._M_elems[bVar5].f = bVar2;
    (this->counters)._M_elems[bVar4]._M_elems[bVar5].t = bVar3;
    (this->counters)._M_elems[bVar4]._M_elems[bVar5].type = '\n';
    if (SVar10 < mate_max_ply) {
      bVar9 = Move::operator!=(m,killers + 2);
      if (bVar9) {
        bVar9 = Move::operator!=(m,killers + 3);
        if (bVar9) {
          bVar9 = Move::operator!=(m,killers);
          if (bVar9) {
            killers[1].f = killers->f;
            UVar8 = killers->type;
            killers[1].t = killers->t;
            killers[1].type = UVar8;
            killers->f = m->f;
            killers->t = m->t;
            killers->type = m->type;
          }
        }
      }
    }
    pMVar7 = (quiets->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    bVar2 = m->f;
    for (pMVar11 = (quiets->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.
                   super__Vector_impl_data._M_start; pMVar11 != pMVar7; pMVar11 = pMVar11 + 1) {
      if (bVar2 != pMVar11->f) {
        piVar1 = (this->history)._M_elems[CVar6]._M_elems[pMVar11->f]._M_elems + pMVar11->t;
        *piVar1 = *piVar1 - iVar12;
      }
    }
    SVar10 = *eval;
  }
  if (~mated_max_ply < SVar10) {
    bVar9 = Move::operator!=(m,killers);
    if (bVar9) {
      bVar9 = Move::operator!=(m,killers + 1);
      if (bVar9) {
        bVar9 = Move::operator!=(m,killers + 2);
        if (bVar9) {
          killers[3].f = killers[2].f;
          UVar8 = killers[2].type;
          killers[3].t = killers[2].t;
          killers[3].type = UVar8;
          killers[2].f = m->f;
          killers[2].t = m->t;
          killers[2].type = m->type;
        }
      }
    }
  }
  return;
}

Assistant:

void Movehistory::update(const position& p,
		const Move& m,
		const Move& previous,
		const int16& depth,
		const Score& eval,
		const std::vector<Move>& quiets,
		Move* killers) {

		const Color c = p.to_move();
		int score = pow(depth, 2);
		if (m.type == Movetype::quiet) {
			history[c][m.f][m.t] += score;
			counters[previous.f][previous.t] = m;
			if (eval < Score::mate_max_ply &&
				m != killers[2] &&
				m != killers[3] &&
				m != killers[0]) {
				killers[1] = killers[0];
				killers[0] = m;
			}
			for (auto& q : quiets) {
				if (m.f == q.f) continue;
				history[c][q.f][q.t] -= score;
			}
		}

		// mate killers
		if (eval >= Score::mate_max_ply &&
			m != killers[0] &&
			m != killers[1] &&
			m != killers[2]) {
			killers[3] = killers[2];
			killers[2] = m;
		}
	}